

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void DockNodeTreeUpdateSplitterFindTouchingNode
               (ImGuiDockNode *node,ImGuiAxis axis,int side,
               ImVector<ImGuiDockNode_*> *touching_nodes)

{
  bool bVar1;
  ImVector<ImGuiDockNode_*> *touching_nodes_local;
  int side_local;
  ImGuiAxis axis_local;
  ImGuiDockNode *node_local;
  
  _side_local = node;
  bVar1 = ImGuiDockNode::IsLeafNode(node);
  if (bVar1) {
    ImVector<ImGuiDockNode_*>::push_back(touching_nodes,(ImGuiDockNode **)&side_local);
  }
  else {
    if (((*(ushort *)&_side_local->ChildNodes[0]->field_0xc4 >> 9 & 1) != 0) &&
       (((_side_local->SplitAxis != axis || (side == 0)) ||
        ((*(ushort *)&_side_local->ChildNodes[1]->field_0xc4 >> 9 & 1) == 0)))) {
      DockNodeTreeUpdateSplitterFindTouchingNode
                (_side_local->ChildNodes[0],axis,side,touching_nodes);
    }
    if (((*(ushort *)&_side_local->ChildNodes[1]->field_0xc4 >> 9 & 1) != 0) &&
       (((_side_local->SplitAxis != axis || (side == 1)) ||
        ((*(ushort *)&_side_local->ChildNodes[0]->field_0xc4 >> 9 & 1) == 0)))) {
      DockNodeTreeUpdateSplitterFindTouchingNode
                (_side_local->ChildNodes[1],axis,side,touching_nodes);
    }
  }
  return;
}

Assistant:

static void DockNodeTreeUpdateSplitterFindTouchingNode(ImGuiDockNode* node, ImGuiAxis axis, int side, ImVector<ImGuiDockNode*>* touching_nodes)
{
    if (node->IsLeafNode())
    {
        touching_nodes->push_back(node);
        return;
    }
    if (node->ChildNodes[0]->IsVisible)
        if (node->SplitAxis != axis || side == 0 || !node->ChildNodes[1]->IsVisible)
            DockNodeTreeUpdateSplitterFindTouchingNode(node->ChildNodes[0], axis, side, touching_nodes);
    if (node->ChildNodes[1]->IsVisible)
        if (node->SplitAxis != axis || side == 1 || !node->ChildNodes[0]->IsVisible)
            DockNodeTreeUpdateSplitterFindTouchingNode(node->ChildNodes[1], axis, side, touching_nodes);
}